

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_HRR_Algorithm_Base.cpp
# Opt level: O0

RRStepType __thiscall
OSTEI_HRR_Algorithm_Base::GetKetRRStep(OSTEI_HRR_Algorithm_Base *this,DAM *dam)

{
  RRStepType RVar1;
  pointer pHVar2;
  vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_> *in_stack_ffffffffffffff88;
  key_type *in_stack_ffffffffffffffa8;
  map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
  *in_stack_ffffffffffffffb0;
  __normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
  local_18 [3];
  
  DAM::notag(in_stack_ffffffffffffffa8);
  std::
  map<DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>,_std::less<DAM>,_std::allocator<std::pair<const_DAM,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>_>_>
  ::at(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  local_18[0]._M_current =
       (HRRDoubletStep *)
       std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>::begin
                 (in_stack_ffffffffffffff88);
  pHVar2 = __gnu_cxx::
           __normal_iterator<const_HRRDoubletStep_*,_std::vector<HRRDoubletStep,_std::allocator<HRRDoubletStep>_>_>
           ::operator->(local_18);
  RVar1 = pHVar2->type;
  DAM::~DAM((DAM *)0x134c4c);
  return RVar1;
}

Assistant:

RRStepType OSTEI_HRR_Algorithm_Base::GetKetRRStep(DAM dam) const
{
    return ketsteps_.at(dam.notag()).begin()->type;
}